

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingParameters.hpp
# Opt level: O0

Vector3f __thiscall eos::fitting::RenderingParameters::get_yaw_pitch_roll(RenderingParameters *this)

{
  Scalar *pSVar1;
  float fVar2;
  float fVar3;
  Matrix<float,_3,_1,_0,_3,_1> MVar4;
  Vector3f VVar5;
  QuaternionBase<Eigen::Quaternion<float,_0>_> local_58 [28];
  Matrix3 local_3c;
  RenderingParameters *this_local;
  Vector3f *ea;
  
  this_local = this;
  Eigen::QuaternionBase<Eigen::Quaternion<float,_0>_>::normalized(local_58);
  Eigen::QuaternionBase<Eigen::Quaternion<float,_0>_>::toRotationMatrix(&local_3c,local_58);
  MVar4 = tait_bryan_angles<float>((Matrix<float,_3,_3,_0,_3,_3> *)this,(Index)&local_3c,1,0);
  fVar3 = MVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2];
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0);
  fVar2 = core::degrees<float>(*pSVar1);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,0);
  *pSVar1 = fVar2;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,1);
  fVar2 = core::degrees<float>(*pSVar1);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,1);
  *pSVar1 = fVar2;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,2);
  VVar5.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       core::degrees<float>(*pSVar1);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)this,2);
  VVar5.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0;
  *pSVar1 = VVar5.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
            [0];
  VVar5.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       fVar3;
  return (Vector3f)
         VVar5.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array;
}

Assistant:

Eigen::Vector3f get_yaw_pitch_roll()
    {
        // We use Eigen's Matrix3::eulerAngles() function with axes (1, 0, 2). In our coordinate system, the x
        // axis is to the right, y up, and z into/out of the screen. So to get yaw first, our first axis is y
        // ('1'), then our x axis ('0') to get pitch, then our z axis ('2') to get roll.
        // We are guessing that the function returns intrinsic angles (the unsupported EulerAngles() module
        // does, but it's an unrelated module).
        // Because eulerAngles() constrains the angles in a different way to what we want, we correct for
        // that in tait_bryan_angles() (which calls eulerAngles() and then modifies the solution accordingly).
        Eigen::Vector3f ea = fitting::tait_bryan_angles(rotation.normalized().toRotationMatrix(), 1, 0, 2);
        ea(0) = core::degrees(ea(0));
        ea(1) = core::degrees(ea(1));
        ea(2) = core::degrees(ea(2));
        return ea;
    }